

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O1

char * NCONF_get_string(CONF *conf,char *group,char *name)

{
  void *pvVar1;
  char *pcVar2;
  CONF_VALUE templ;
  char *local_18;
  char *pcStack_10;
  undefined8 local_8;
  
  local_18 = "default";
  if (group != (char *)0x0) {
    local_18 = group;
  }
  local_8 = 0;
  pcStack_10 = name;
  pvVar1 = OPENSSL_lh_retrieve((_LHASH *)conf->meth,&local_18,lh_CONF_VALUE_call_hash_func,
                               lh_CONF_VALUE_call_cmp_func);
  if (pvVar1 == (void *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = *(char **)((long)pvVar1 + 0x10);
  }
  return pcVar2;
}

Assistant:

const char *NCONF_get_string(const CONF *conf, const char *section,
                             const char *name) {
  CONF_VALUE templ, *value;

  if (section == NULL) {
    section = kDefaultSectionName;
  }

  OPENSSL_memset(&templ, 0, sizeof(templ));
  templ.section = (char *)section;
  templ.name = (char *)name;
  value = lh_CONF_VALUE_retrieve(conf->values, &templ);
  if (value == NULL) {
    return NULL;
  }
  return value->value;
}